

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::Environment::Environment
          (Environment *this,Context *context,deUint32 maxResourceConsumers_)

{
  deUint32 dVar1;
  PlatformInterface *pPVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  ProgramCollection<vk::ProgramBinary> *pPVar5;
  deUint32 maxResourceConsumers__local;
  Context *context_local;
  Environment *this_local;
  
  pPVar2 = Context::getPlatformInterface(context);
  this->vkp = pPVar2;
  pDVar3 = Context::getDeviceInterface(context);
  this->vkd = pDVar3;
  pVVar4 = Context::getDevice(context);
  this->device = pVVar4;
  dVar1 = Context::getUniversalQueueFamilyIndex(context);
  this->queueFamilyIndex = dVar1;
  pPVar5 = Context::getBinaryCollection(context);
  this->programBinaries = pPVar5;
  this->allocationCallbacks = (VkAllocationCallbacks *)0x0;
  this->maxResourceConsumers = maxResourceConsumers_;
  return;
}

Assistant:

Environment (Context& context, deUint32 maxResourceConsumers_)
		: vkp					(context.getPlatformInterface())
		, vkd					(context.getDeviceInterface())
		, device				(context.getDevice())
		, queueFamilyIndex		(context.getUniversalQueueFamilyIndex())
		, programBinaries		(context.getBinaryCollection())
		, allocationCallbacks	(DE_NULL)
		, maxResourceConsumers	(maxResourceConsumers_)
	{
	}